

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::detail::
       make_function_aux<std::__cxx11::string(HighFreqDataType::*)()const,boost::python::default_call_policies,boost::mpl::vector2<std::__cxx11::string,HighFreqDataType&>>
                 (first_type f,default_call_policies *p,
                 vector2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HighFreqDataType_&>
                 *param_3)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  object_base in_RDI;
  caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HighFreqDataType_&>_>
  *in_stack_ffffffffffffff88;
  py_function *in_stack_ffffffffffffff90;
  caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HighFreqDataType_&>_>
  local_50;
  py_function local_40 [8];
  
  caller<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(HighFreqDataType::*)()_const,_boost::python::default_call_policies,_boost::mpl::vector2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HighFreqDataType_&>_>
  ::caller(&local_50,in_RSI,in_RDX);
  objects::py_function::
  py_function<boost::python::detail::caller<std::__cxx11::string(HighFreqDataType::*)()const,boost::python::default_call_policies,boost::mpl::vector2<std::__cxx11::string,HighFreqDataType&>>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  objects::function_object((objects *)in_RDI.m_ptr,local_40);
  objects::py_function::~py_function((py_function *)0x3a81eb);
  return (object)(object_base)in_RDI.m_ptr;
}

Assistant:

object make_function_aux(
      F f                               // An object that can be invoked by detail::invoke()
      , CallPolicies const& p           // CallPolicies to use in the invocation
      , Sig const&                      // An MPL sequence of argument types expected by F
      )
  {
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
      );
  }